

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O2

bool __thiscall CaDiCaL::Solver::configure(Solver *this,char *name)

{
  bool bVar1;
  char *__ptr;
  size_t sStack_20;
  
  if ((this->internal != (Internal *)0x0) && (this->trace_api_file != (FILE *)0x0)) {
    trace_api_call(this,"configure",name);
  }
  require_solver_pointer_to_be_non_zero
            (this,"bool CaDiCaL::Solver::configure(const char *)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
            );
  if (this->external == (External *)0x0) {
    fatal_message_start();
    fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
            "bool CaDiCaL::Solver::configure(const char *)",
            "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
           );
    __ptr = "external solver not initialized";
LAB_00684a03:
    sStack_20 = 0x1f;
  }
  else {
    if (this->internal == (Internal *)0x0) {
      fatal_message_start();
      fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
              "bool CaDiCaL::Solver::configure(const char *)",
              "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             );
      __ptr = "internal solver not initialized";
      goto LAB_00684a03;
    }
    if ((this->_state & VALID) != 0) {
      if (this->_state == CONFIGURING) {
        bVar1 = Config::set(&this->internal->opts,name);
        return bVar1;
      }
      fatal_message_start();
      fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
              "bool CaDiCaL::Solver::configure(const char *)",
              "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             );
      fprintf(_stderr,"can only set configuration \'%s\' right after initialization",name);
      fputc(10,_stderr);
      goto LAB_00684aa4;
    }
    fatal_message_start();
    fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
            "bool CaDiCaL::Solver::configure(const char *)",
            "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
           );
    __ptr = "solver in invalid state";
    sStack_20 = 0x17;
  }
  fwrite(__ptr,sStack_20,1,_stderr);
  fputc(10,_stderr);
LAB_00684aa4:
  fflush(_stderr);
  abort();
}

Assistant:

bool Solver::configure (const char *name) {
  TRACE ("configure", name);
  LOG_API_CALL_BEGIN ("configure", name);
  REQUIRE_VALID_STATE ();
  REQUIRE (state () == CONFIGURING,
           "can only set configuration '%s' right after initialization",
           name);
  bool res = Config::set (internal->opts, name);
  LOG_API_CALL_END ("configure", name, res);
  return res;
}